

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::cancelChain(QFutureInterfaceBase *this,CancelMode mode)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QFutureInterfaceBasePrivate::CancelOption> in_stack_0000002c;
  QFutureInterfaceBasePrivate *prev;
  QMutexLocker<QBasicMutex> prevLocker;
  QMutexLocker<QBasicMutex> locker;
  undefined4 in_stack_ffffffffffffff78;
  CancelOption in_stack_ffffffffffffff7c;
  QMutexLocker<QBasicMutex> *in_stack_ffffffffffffff80;
  CancelMode in_stack_ffffffffffffffac;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QBasicMutex>::QMutexLocker
            (in_stack_ffffffffffffff80,
             (QBasicMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_48 = *(long *)(*(long *)(in_RDI + 8) + 0xb0);
  while (local_48 != 0) {
    QFlags<QFutureInterfaceBasePrivate::CancelOption>::QFlags
              ((QFlags<QFutureInterfaceBasePrivate::CancelOption> *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
    QFutureInterfaceBasePrivate::cancelImpl
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (CancelOptions)in_stack_0000002c.i);
    QMutexLocker<QBasicMutex>::QMutexLocker
              (in_stack_ffffffffffffff80,
               (QBasicMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_48 = *(long *)(local_48 + 0xb0);
    QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffff80);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffff80);
  QFlags<QFutureInterfaceBasePrivate::CancelOption>::QFlags
            (*(QFlags<QFutureInterfaceBasePrivate::CancelOption> **)(in_RDI + 8),
             in_stack_ffffffffffffff7c);
  QFutureInterfaceBasePrivate::cancelImpl
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(CancelOptions)in_stack_0000002c.i)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::cancelChain(QFutureInterfaceBase::CancelMode mode)
{
    // go up through the list of continuations, cancelling each of them
    {
        QMutexLocker locker(&d->continuationMutex);
        QFutureInterfaceBasePrivate *prev = d->nonConcludedParent;
        while (prev) {
            // Do not cancel continuations, because we're going bottom-to-top
            prev->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::None);
            QMutexLocker prevLocker(&prev->continuationMutex);
            prev = prev->nonConcludedParent;
        }
    }
    // finally, cancel self and all next continuations
    d->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::CancelContinuations);
}